

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O1

Weight ON_Font::WeightFromAppleFontWeightTrait(double apple_font_weight_trait)

{
  bool bVar1;
  Weight WVar2;
  int iVar3;
  int iVar4;
  
  bVar1 = ON_IsValid(apple_font_weight_trait);
  if (bVar1) {
    iVar3 = (int)((double)(-(ulong)(ABS(apple_font_weight_trait) <= 1.0) &
                          (ulong)apple_font_weight_trait) * 750.0 + 400.0);
    iVar4 = 1000;
    if (iVar3 < 1000) {
      iVar4 = iVar3;
    }
    iVar3 = 1;
    if (1 < iVar4) {
      iVar3 = iVar4;
    }
    WVar2 = WeightFromWindowsLogfontWeight(iVar3);
    return WVar2;
  }
  return Unset;
}

Assistant:

ON_Font::Weight ON_Font::WeightFromAppleFontWeightTrait(
  double apple_font_weight_trait
)
{
  if (false == ON_IsValid(apple_font_weight_trait))
    return ON_Font::Weight::Unset;

  const double x = (-1.0 <= apple_font_weight_trait && apple_font_weight_trait <= 1.0) ? apple_font_weight_trait : 0.0;
  int windows_logfont_weight = (int)(400.0 + 750.0*x);
  if (windows_logfont_weight < 1)
    windows_logfont_weight = 1;
  else if (windows_logfont_weight > 1000)
    windows_logfont_weight = 1000;
  return ON_Font::WeightFromWindowsLogfontWeight(windows_logfont_weight);
}